

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O0

int json_print_anydataxml(lyout *out,int level,lyd_node *node,int toplevel,int options)

{
  hash_table *phVar1;
  ly_ctx *ctx;
  int iVar2;
  int *piVar3;
  lys_module *plVar4;
  size_t sVar5;
  char *pcVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  int local_6c;
  char *local_50;
  char *schema;
  char *buf;
  lyd_node *plStack_38;
  int is_object;
  lyd_node_anydata *any;
  int options_local;
  int toplevel_local;
  lyd_node *node_local;
  lyout *plStack_18;
  int level_local;
  lyout *out_local;
  
  buf._4_4_ = 0;
  local_50 = (char *)0x0;
  plStack_38 = node;
  any._0_4_ = options;
  any._4_4_ = toplevel;
  _options_local = node;
  node_local._4_4_ = level;
  plStack_18 = out;
  piVar3 = __errno_location();
  *piVar3 = 0;
  if (((any._4_4_ == 0) && (_options_local->parent != (lyd_node *)0x0)) &&
     (iVar2 = nscmp(_options_local,_options_local->parent), iVar2 == 0)) {
    ly_print(plStack_18,"%*s\"%s\":",(ulong)(uint)(node_local._4_4_ << 1),"");
  }
  else {
    plVar4 = lys_node_module(_options_local->schema);
    local_50 = plVar4->name;
    ly_print(plStack_18,"%*s\"%s:%s\":",(ulong)(uint)(node_local._4_4_ << 1),"",local_50,
             _options_local->schema->name);
  }
  if (node_local._4_4_ != 0) {
    node_local._4_4_ = node_local._4_4_ + 1;
  }
  switch(*(undefined4 *)&plStack_38->field_0x34) {
  case 0:
  case 4:
    if (node_local._4_4_ != 0) {
      ly_print(plStack_18," ");
    }
    if (plStack_38->ht == (hash_table *)0x0) {
      ly_print(plStack_18,"\"\"");
    }
    else {
      json_print_string(plStack_18,(char *)plStack_38->ht);
    }
    break;
  case 1:
  case 3:
  case 5:
  case 0x20:
  case 0x21:
    ly_log(_options_local->schema->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_json.c"
           ,0x1e9);
    return 1;
  case 2:
    if (node_local._4_4_ != 0) {
      ly_print(plStack_18,"\n");
    }
    if (plStack_38->ht != (hash_table *)0x0) {
      ly_print(plStack_18,"%s",plStack_38->ht);
    }
    if ((node_local._4_4_ != 0) &&
       ((plStack_38->ht == (hash_table *)0x0 ||
        (phVar1 = plStack_38->ht, sVar5 = strlen((char *)plStack_38->ht),
        *(char *)((long)phVar1 + (sVar5 - 1)) != '\n')))) {
      ly_print(plStack_18,"\n");
    }
    break;
  case 8:
    uVar7 = 0;
    if (node_local._4_4_ != 0) {
      uVar7 = 0x22;
    }
    lyxml_print_mem(&schema,(lyxml_elem *)plStack_38->ht,uVar7 | 0x10);
    if (node_local._4_4_ != 0) {
      ly_print(plStack_18," ");
    }
    json_print_string(plStack_18,schema);
    free(schema);
    break;
  case 0x10:
    buf._4_4_ = 1;
    pcVar8 = "";
    if (node_local._4_4_ != 0) {
      pcVar8 = " ";
    }
    pcVar9 = "";
    if (node_local._4_4_ != 0) {
      pcVar9 = "\n";
    }
    ly_print(plStack_18,"%s{%s",pcVar8,pcVar9);
    iVar2 = json_print_nodes(plStack_18,node_local._4_4_,(lyd_node *)plStack_38->ht,1,0,
                             (uint)any & 0xfffffeff | 1);
    if (iVar2 != 0) {
      return 1;
    }
  }
  if (_options_local->attr != (lyd_attr *)0x0) {
    if (local_50 == (char *)0x0) {
      pcVar8 = "";
      if (node_local._4_4_ != 0) {
        pcVar8 = "\n";
      }
      pcVar9 = "";
      if (node_local._4_4_ != 0) {
        pcVar9 = " ";
      }
      pcVar6 = "";
      if (node_local._4_4_ != 0) {
        pcVar6 = "\n";
      }
      ly_print(plStack_18,",%s%*s\"@%s\":%s{%s",pcVar8,(ulong)(uint)(node_local._4_4_ << 1),"",
               _options_local->schema->name,pcVar9,pcVar6);
    }
    else {
      pcVar8 = "";
      if (node_local._4_4_ != 0) {
        pcVar8 = "\n";
      }
      pcVar9 = "";
      if (node_local._4_4_ != 0) {
        pcVar9 = " ";
      }
      pcVar6 = "";
      if (node_local._4_4_ != 0) {
        pcVar6 = "\n";
      }
      ly_print(plStack_18,",%s%*s\"@%s:%s\":%s{%s",pcVar8,(ulong)(uint)(node_local._4_4_ << 1),"",
               local_50,_options_local->schema->name,pcVar9,pcVar6);
    }
    if (node_local._4_4_ == 0) {
      local_6c = node_local._4_4_;
    }
    else {
      local_6c = node_local._4_4_ + 1;
    }
    iVar2 = json_print_attrs(plStack_18,local_6c,_options_local,(lys_module *)0x0);
    if (iVar2 != 0) {
      return 1;
    }
    ly_print(plStack_18,"%*s}",(ulong)(uint)(node_local._4_4_ << 1),"");
  }
  if (node_local._4_4_ != 0) {
    node_local._4_4_ = node_local._4_4_ + -1;
  }
  if (buf._4_4_ != 0) {
    ly_print(plStack_18,"%*s}",(ulong)(uint)(node_local._4_4_ << 1),"");
  }
  piVar3 = __errno_location();
  iVar2 = *piVar3;
  if (iVar2 != 0) {
    ctx = _options_local->schema->module->ctx;
    piVar3 = __errno_location();
    pcVar8 = strerror(*piVar3);
    ly_log(ctx,LY_LLERR,LY_ESYS,"Print error (%s).",pcVar8);
  }
  out_local._4_4_ = (uint)(iVar2 != 0);
  return out_local._4_4_;
}

Assistant:

static int
json_print_anydataxml(struct lyout *out, int level, const struct lyd_node *node, int toplevel, int options)
{
    struct lyd_node_anydata *any = (struct lyd_node_anydata *)node;
    int is_object = 0;
    char *buf;
    const char *schema = NULL;

    LY_PRINT_SET;

    if (toplevel || !node->parent || nscmp(node, node->parent)) {
        /* print "namespace" */
        schema = lys_node_module(node->schema)->name;
        ly_print(out, "%*s\"%s:%s\":", LEVEL, INDENT, schema, node->schema->name);
    } else {
        ly_print(out, "%*s\"%s\":", LEVEL, INDENT, node->schema->name);
    }
    if (level) {
        level++;
    }

    switch (any->value_type) {
    case LYD_ANYDATA_DATATREE:
        is_object = 1;
        ly_print(out, "%s{%s", (level ? " " : ""), (level ? "\n" : ""));
        /* do not print any default values nor empty containers */
        if (json_print_nodes(out, level, any->value.tree, 1, 0,  LYP_WITHSIBLINGS | (options & ~LYP_NETCONF))) {
            return EXIT_FAILURE;
        }
        break;
    case LYD_ANYDATA_JSON:
        if (level) {
            ly_print(out, "\n");
        }
        if (any->value.str) {
            ly_print(out, "%s", any->value.str);
        }
        if (level && (!any->value.str || (any->value.str[strlen(any->value.str) - 1] != '\n'))) {
            /* do not print 2 newlines */
            ly_print(out, "\n");
        }
        break;
    case LYD_ANYDATA_XML:
        lyxml_print_mem(&buf, any->value.xml, (level ? LYXML_PRINT_FORMAT | LYXML_PRINT_NO_LAST_NEWLINE : 0)
                                               | LYXML_PRINT_SIBLINGS);
        if (level) {
            ly_print(out, " ");
        }
        json_print_string(out, buf);
        free(buf);
        break;
    case LYD_ANYDATA_CONSTSTRING:
    case LYD_ANYDATA_SXML:
        if (level) {
            ly_print(out, " ");
        }
        if (any->value.str) {
            json_print_string(out, any->value.str);
        } else {
            ly_print(out, "\"\"");
        }
        break;
    case LYD_ANYDATA_STRING:
    case LYD_ANYDATA_SXMLD:
    case LYD_ANYDATA_JSOND:
    case LYD_ANYDATA_LYBD:
    case LYD_ANYDATA_LYB:
        /* other formats are not supported */
        LOGINT(node->schema->module->ctx);
        return EXIT_FAILURE;
    }

    /* print attributes as sibling leaf */
    if (node->attr) {
        if (schema) {
            ly_print(out, ",%s%*s\"@%s:%s\":%s{%s", (level ? "\n" : ""), LEVEL, INDENT, schema, node->schema->name,
                     (level ? " " : ""), (level ? "\n" : ""));
        } else {
            ly_print(out, ",%s%*s\"@%s\":%s{%s", (level ? "\n" : ""), LEVEL, INDENT, node->schema->name,
                     (level ? " " : ""), (level ? "\n" : ""));
        }
        if (json_print_attrs(out, (level ? level + 1 : level), node, NULL)) {
            return EXIT_FAILURE;
        }
        ly_print(out, "%*s}", LEVEL, INDENT);
    }

    if (level) {
        level--;
    }
    if (is_object) {
        ly_print(out, "%*s}", LEVEL, INDENT);
    }

    LY_PRINT_RET(node->schema->module->ctx);
}